

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

Vec_Wrd_t * Gia_ManSimCombine(int nInputs,Vec_Wrd_t *vBase,Vec_Wrd_t *vAddOn,int nWordsUse)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Wrd_t *p;
  word *local_60;
  word *local_58;
  word *pSimsA;
  word *pSimsB;
  Vec_Wrd_t *vSimsIn;
  int local_30;
  int w;
  int i;
  int nWordsAddOn;
  int nWordsBase;
  int nWordsUse_local;
  Vec_Wrd_t *vAddOn_local;
  Vec_Wrd_t *vBase_local;
  int nInputs_local;
  
  iVar1 = Vec_WrdSize(vBase);
  iVar1 = iVar1 / nInputs;
  iVar2 = Vec_WrdSize(vAddOn);
  iVar2 = iVar2 / nInputs;
  p = Vec_WrdAlloc(nInputs * (iVar1 + nWordsUse));
  iVar3 = Vec_WrdSize(vBase);
  if (iVar3 % nInputs != 0) {
    __assert_fail("Vec_WrdSize(vBase) % nInputs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x109,"Vec_Wrd_t *Gia_ManSimCombine(int, Vec_Wrd_t *, Vec_Wrd_t *, int)");
  }
  iVar3 = Vec_WrdSize(vAddOn);
  if (iVar3 % nInputs == 0) {
    if (iVar2 < nWordsUse) {
      __assert_fail("nWordsUse <= nWordsAddOn",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                    ,0x10b,"Vec_Wrd_t *Gia_ManSimCombine(int, Vec_Wrd_t *, Vec_Wrd_t *, int)");
    }
    for (local_30 = 0; local_30 < nInputs; local_30 = local_30 + 1) {
      if (iVar1 == 0) {
        local_58 = (word *)0x0;
      }
      else {
        local_58 = Vec_WrdEntryP(vBase,local_30 * iVar1);
      }
      if (iVar2 == 0) {
        local_60 = (word *)0x0;
      }
      else {
        local_60 = Vec_WrdEntryP(vAddOn,local_30 * iVar2);
      }
      for (vSimsIn._4_4_ = 0; vSimsIn._4_4_ < iVar1; vSimsIn._4_4_ = vSimsIn._4_4_ + 1) {
        Vec_WrdPush(p,local_58[vSimsIn._4_4_]);
      }
      for (vSimsIn._4_4_ = 0; vSimsIn._4_4_ < nWordsUse; vSimsIn._4_4_ = vSimsIn._4_4_ + 1) {
        Vec_WrdPush(p,local_60[vSimsIn._4_4_]);
      }
    }
    iVar1 = Vec_WrdSize(p);
    iVar2 = Vec_WrdCap(p);
    if (iVar1 != iVar2) {
      iVar1 = Vec_WrdSize(p);
      if (0xf < iVar1) {
        __assert_fail("Vec_WrdSize(vSimsIn) == Vec_WrdCap(vSimsIn) || Vec_WrdSize(vSimsIn) < 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                      ,0x115,"Vec_Wrd_t *Gia_ManSimCombine(int, Vec_Wrd_t *, Vec_Wrd_t *, int)");
      }
    }
    return p;
  }
  __assert_fail("Vec_WrdSize(vAddOn) % nInputs == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x10a,"Vec_Wrd_t *Gia_ManSimCombine(int, Vec_Wrd_t *, Vec_Wrd_t *, int)");
}

Assistant:

Vec_Wrd_t * Gia_ManSimCombine( int nInputs, Vec_Wrd_t * vBase, Vec_Wrd_t * vAddOn, int nWordsUse )
{
    int nWordsBase  = Vec_WrdSize(vBase)  / nInputs;
    int nWordsAddOn = Vec_WrdSize(vAddOn) / nInputs; int i, w;
    Vec_Wrd_t * vSimsIn = Vec_WrdAlloc( nInputs * (nWordsBase + nWordsUse) );
    assert( Vec_WrdSize(vBase)  % nInputs == 0 );
    assert( Vec_WrdSize(vAddOn) % nInputs == 0 );
    assert( nWordsUse <= nWordsAddOn );
    for ( i = 0; i < nInputs; i++ )
    {
        word * pSimsB = nWordsBase  ? Vec_WrdEntryP( vBase,  i * nWordsBase )  : NULL;
        word * pSimsA = nWordsAddOn ? Vec_WrdEntryP( vAddOn, i * nWordsAddOn ) : NULL;
        for ( w = 0; w < nWordsBase; w++ )
            Vec_WrdPush( vSimsIn, pSimsB[w] );
        for ( w = 0; w < nWordsUse; w++ )
            Vec_WrdPush( vSimsIn, pSimsA[w] );
    }
    assert( Vec_WrdSize(vSimsIn) == Vec_WrdCap(vSimsIn) || Vec_WrdSize(vSimsIn) < 16 );
    return vSimsIn;
}